

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTreeInterfaces.cpp
# Opt level: O2

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
 __thiscall
Indexing::CodeTreeTIS<Indexing::DemodulatorData>::getGeneralizations
          (CodeTreeTIS<Indexing::DemodulatorData> *this,TypedTermList t,bool retrieveSubstitutions)

{
  int *piVar1;
  ResultIterator *this_00;
  bool in_R8B;
  
  if (*(CodeBlock **)(t.super_TermList._content._content + 0x20) == (CodeBlock *)0x0) {
    Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
    ::getEmpty();
  }
  else {
    this_00 = (ResultIterator *)ResultIterator::operator_new(0x58);
    ResultIterator::ResultIterator
              (this_00,(CodeTreeTIS<Indexing::DemodulatorData> *)t.super_TermList._content._content,
               (uint64_t)t._sort._content,in_R8B);
    (this->super_TermIndexingStructure<Indexing::DemodulatorData>)._vptr_TermIndexingStructure =
         (_func_int **)this_00;
    piVar1 = &(this_00->
              super_IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
              )._refCnt;
    *piVar1 = *piVar1 + 1;
  }
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
            *)this;
}

Assistant:

VirtualIterator<QueryRes<ResultSubstitutionSP, Data>> CodeTreeTIS<Data>::getGeneralizations(TypedTermList t, bool retrieveSubstitutions)
{
  if(_ct.isEmpty()) {
    return VirtualIterator<QueryRes<ResultSubstitutionSP, Data>>::getEmpty();
  }

  return vi( new ResultIterator(this, t, retrieveSubstitutions) );
}